

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Bus_ManReadInOutLoads(Bus_Man_t *p)

{
  Vec_Ptr_t *p_00;
  SC_Lib *p_01;
  Abc_Obj_t *p_02;
  char *pcVar1;
  SC_Cell *pSVar2;
  int iVar3;
  float fVar4;
  
  iVar3 = 0;
  fVar4 = Abc_FrameReadMaxLoad();
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar4 = Abc_FrameReadMaxLoad();
    for (; p_00 = p->pNtk->vCos, iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
      p_02 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar3);
      Bus_SclObjSetCin(p_02,fVar4);
    }
  }
  pcVar1 = Abc_FrameReadDrivingCell();
  if (pcVar1 != (char *)0x0) {
    p_01 = p->pLib;
    pcVar1 = Abc_FrameReadDrivingCell();
    iVar3 = Abc_SclCellFind(p_01,pcVar1);
    if (iVar3 == -1) {
      pcVar1 = Abc_FrameReadDrivingCell();
      printf("Cannot find the default PI driving cell (%s) in the library.\n",pcVar1);
      return;
    }
    pSVar2 = (SC_Cell *)Vec_PtrEntry(&p->pLib->vCells,iVar3);
    p->pPiDrive = pSVar2;
    if (pSVar2 == (SC_Cell *)0x0) {
      __assert_fail("p->pPiDrive != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                    ,0x98,"void Bus_ManReadInOutLoads(Bus_Man_t *)");
    }
    if (pSVar2->n_inputs != 1) {
      __assert_fail("p->pPiDrive->n_inputs == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                    ,0x99,"void Bus_ManReadInOutLoads(Bus_Man_t *)");
    }
  }
  return;
}

Assistant:

void Bus_ManReadInOutLoads( Bus_Man_t * p )
{
    if ( Abc_FrameReadMaxLoad() )
    {
        Abc_Obj_t * pObj; int i;
        float MaxLoad = Abc_FrameReadMaxLoad();
        Abc_NtkForEachCo( p->pNtk, pObj, i )
            Bus_SclObjSetCin( pObj, MaxLoad );
//        printf( "Default output load is specified (%f ff).\n", MaxLoad );
    }
    if ( Abc_FrameReadDrivingCell() )
    {
        int iCell = Abc_SclCellFind( p->pLib, Abc_FrameReadDrivingCell() );
        if ( iCell == -1 )
            printf( "Cannot find the default PI driving cell (%s) in the library.\n", Abc_FrameReadDrivingCell() );
        else
        {
//            printf( "Default PI driving cell is specified (%s).\n", Abc_FrameReadDrivingCell() );
            p->pPiDrive = SC_LibCell( p->pLib, iCell );
            assert( p->pPiDrive != NULL );
            assert( p->pPiDrive->n_inputs == 1 );
//            printf( "Default input driving cell is specified (%s).\n", p->pPiDrive->pName );
        }
    }
}